

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O3

void put_demapped_gray(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  JDIMENSION JVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  tga_dest_ptr dest;
  _func_void_j_decompress_ptr_djpeg_dest_ptr *__ptr;
  long lVar4;
  
  __ptr = dinfo[1].start_output;
  JVar1 = cinfo->output_width;
  if (JVar1 != 0) {
    pJVar2 = *cinfo->colormap;
    pJVar3 = *dinfo->buffer;
    lVar4 = 0;
    do {
      __ptr[lVar4] = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar2[pJVar3[lVar4]];
      lVar4 = lVar4 + 1;
    } while (JVar1 != (JDIMENSION)lVar4);
    __ptr = dinfo[1].start_output;
  }
  fwrite(__ptr,1,(ulong)*(uint *)&dinfo[1].put_pixel_rows,(FILE *)dinfo->output_file);
  return;
}

Assistant:

METHODDEF(void)
put_demapped_gray(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                  JDIMENSION rows_supplied)
{
  tga_dest_ptr dest = (tga_dest_ptr)dinfo;
  register JSAMPROW inptr;
  register char *outptr;
  register JSAMPROW color_map0 = cinfo->colormap[0];
  register JDIMENSION col;

  inptr = dest->pub.buffer[0];
  outptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    *outptr++ = color_map0[*inptr++];
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}